

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_sse4.c
# Opt level: O0

void av1_highbd_convolve_2d_scale_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params,int bd)

{
  int fo_vert;
  int ytaps;
  int xtaps;
  int im_h;
  int16_t tmp [34304];
  undefined1 auStackY_10c38 [284];
  int in_stack_fffffffffffef4e4;
  int in_stack_fffffffffffef4e8;
  int in_stack_fffffffffffef4ec;
  int16_t *in_stack_fffffffffffef4f0;
  int in_stack_fffffffffffef4fc;
  uint16_t *in_stack_fffffffffffef500;
  int in_stack_fffffffffffef5fc;
  int in_stack_fffffffffffef600;
  int in_stack_fffffffffffef604;
  uint16_t *in_stack_fffffffffffef608;
  int in_stack_fffffffffffef614;
  int16_t *in_stack_fffffffffffef618;
  int in_stack_fffffffffffef6e0;
  InterpFilterParams *in_stack_fffffffffffef6e8;
  int in_stack_fffffffffffef6f0;
  int in_stack_fffffffffffef6f8;
  int in_stack_fffffffffffefb20;
  int in_stack_fffffffffffefb28;
  InterpFilterParams *in_stack_fffffffffffefb30;
  ConvolveParams *in_stack_fffffffffffefb38;
  int in_stack_fffffffffffefb40;
  
  memset(auStackY_10c38,0,0x10c00);
  highbd_hfilter8(in_stack_fffffffffffef500,in_stack_fffffffffffef4fc,in_stack_fffffffffffef4f0,
                  in_stack_fffffffffffef4ec,in_stack_fffffffffffef4e8,in_stack_fffffffffffef4e4,
                  in_stack_fffffffffffef6e0,in_stack_fffffffffffef6e8,in_stack_fffffffffffef6f0,
                  in_stack_fffffffffffef6f8);
  highbd_vfilter8(in_stack_fffffffffffef618,in_stack_fffffffffffef614,in_stack_fffffffffffef608,
                  in_stack_fffffffffffef604,in_stack_fffffffffffef600,in_stack_fffffffffffef5fc,
                  in_stack_fffffffffffefb20,in_stack_fffffffffffefb28,in_stack_fffffffffffefb30,
                  in_stack_fffffffffffefb38,in_stack_fffffffffffefb40);
  return;
}

Assistant:

void av1_highbd_convolve_2d_scale_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int x_step_qn, const int subpel_y_qn, const int y_step_qn,
    ConvolveParams *conv_params, int bd) {
  // TODO(yaowu): Move this out of stack
  DECLARE_ALIGNED(16, int16_t,
                  tmp[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE]);
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;
  const int xtaps = filter_params_x->taps;
  const int ytaps = filter_params_y->taps;
  const int fo_vert = ytaps / 2 - 1;

  memset(tmp, 0, sizeof(tmp));
  assert((xtaps == 8) && (ytaps == 8));
  (void)xtaps;

  // horizontal filter
  highbd_hfilter8(src - fo_vert * src_stride, src_stride, tmp, w, im_h,
                  subpel_x_qn, x_step_qn, filter_params_x, conv_params->round_0,
                  bd);

  // vertical filter (input is transposed)
  highbd_vfilter8(tmp, im_h, dst, dst_stride, w, h, subpel_y_qn, y_step_qn,
                  filter_params_y, conv_params, bd);
}